

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O0

BVec4 __thiscall deqp::gles3::Functional::getChannelMask(Functional *this,ChannelOrder order)

{
  ChannelOrder order_local;
  
  switch(order) {
  case R:
    tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)this,true,false,false,false);
    break;
  default:
    tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)this,false);
    break;
  case RG:
    tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)this,true,true,false,false);
    break;
  case RGB:
    tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)this,true,true,true,false);
    break;
  case RGBA:
    tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)this,true,true,true,true);
    break;
  case sRGB:
    tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)this,true,true,true,false);
    break;
  case sRGBA:
    tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)this,true,true,true,true);
  }
  return (BVec4)SUB84(this,0);
}

Assistant:

static tcu::BVec4 getChannelMask (tcu::TextureFormat::ChannelOrder order)
{
	switch (order)
	{
		case tcu::TextureFormat::R:		return tcu::BVec4(true,	false,	false,	false);
		case tcu::TextureFormat::RG:	return tcu::BVec4(true,	true,	false,	false);
		case tcu::TextureFormat::RGB:	return tcu::BVec4(true,	true,	true,	false);
		case tcu::TextureFormat::RGBA:	return tcu::BVec4(true,	true,	true,	true);
		case tcu::TextureFormat::sRGB:	return tcu::BVec4(true,	true,	true,	false);
		case tcu::TextureFormat::sRGBA:	return tcu::BVec4(true,	true,	true,	true);
		default:
			DE_ASSERT(false);
			return tcu::BVec4(false);
	}
}